

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExternUdpDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::UdpPortListSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          Token *args_4,UdpPortListSyntax *args_5)

{
  Token externKeyword;
  Token primitive;
  Token name;
  ExternUdpDeclSyntax *this_00;
  
  this_00 = (ExternUdpDeclSyntax *)allocate(this,0xc0,8);
  externKeyword.kind = args_1->kind;
  externKeyword._2_1_ = args_1->field_0x2;
  externKeyword.numFlags.raw = (args_1->numFlags).raw;
  externKeyword.rawLen = args_1->rawLen;
  externKeyword.info = args_1->info;
  name.kind = args_4->kind;
  name._2_1_ = args_4->field_0x2;
  name.numFlags.raw = (args_4->numFlags).raw;
  name.rawLen = args_4->rawLen;
  name.info = args_4->info;
  primitive.kind = args_3->kind;
  primitive._2_1_ = args_3->field_0x2;
  primitive.numFlags.raw = (args_3->numFlags).raw;
  primitive.rawLen = args_3->rawLen;
  primitive.info = args_3->info;
  syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax
            (this_00,args,externKeyword,args_2,primitive,name,args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }